

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluatePostModify(ExpressionEvalContext *ctx,ExprPostModify *expression)

{
  SynBase *source;
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  ExprBase *lhs;
  ExprIntegerLiteral *this;
  ExprBase *value_00;
  SynBinaryOpType op;
  ExprBase *modified;
  ExprBase *value;
  ExprBase *ptr;
  ExprPostModify *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar2)->targetYield != 0)) {
    pEVar3 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar3,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return pEVar3;
  }
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    pEVar3 = Evaluate(ctx,expression->value);
    if (pEVar3 == (ExprBase *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      lhs = CreateLoad(ctx,pEVar3);
      if (lhs == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        source = (expression->super_ExprBase).source;
        this = ExpressionContext::get<ExprIntegerLiteral>(ctx->ctx);
        ExprIntegerLiteral::ExprIntegerLiteral(this,(expression->super_ExprBase).source,lhs->type,1)
        ;
        op = SYN_BINARY_OP_SUB;
        if ((expression->isIncrement & 1U) != 0) {
          op = SYN_BINARY_OP_ADD;
        }
        value_00 = CreateBinaryOp(ctx,source,lhs,&this->super_ExprBase,op);
        if (value_00 == (ExprBase *)0x0) {
          ctx_local = (ExpressionEvalContext *)0x0;
        }
        else {
          bVar1 = CreateStore(ctx,pEVar3,value_00);
          if (bVar1) {
            ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,lhs);
          }
          else {
            ctx_local = (ExpressionEvalContext *)0x0;
          }
        }
      }
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluatePostModify(ExpressionEvalContext &ctx, ExprPostModify *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *ptr = Evaluate(ctx, expression->value);

	if(!ptr)
		return NULL;

	ExprBase *value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	ExprBase *modified = CreateBinaryOp(ctx, expression->source, value, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, value->type, 1), expression->isIncrement ? SYN_BINARY_OP_ADD : SYN_BINARY_OP_SUB);

	if(!modified)
		return NULL;

	if(!CreateStore(ctx, ptr, modified))
		return NULL;

	return CheckType(expression, value);
}